

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.h
# Opt level: O1

void __thiscall
kj::Canceler::AdapterImpl<capnp::Capability::Client>::AdapterImpl
          (AdapterImpl<capnp::Capability::Client> *this,
          PromiseFulfiller<capnp::Capability::Client> *fulfiller,Canceler *canceler,
          Promise<capnp::Capability::Client> *inner)

{
  OwnPromiseNode node;
  void *continuationTracePtr;
  OwnPromiseNode local_58;
  PromiseArenaMember *local_50;
  anon_class_8_1_a7efefcd_for_errorHandler local_48;
  anon_class_8_1_a7efefcd_for_func local_40;
  SourceLocation local_38;
  
  AdapterBase::AdapterBase(&this->super_AdapterBase,canceler);
  (this->super_AdapterBase)._vptr_AdapterBase = (_func_int **)&PTR_cancel_006f8b10;
  this->fulfiller = fulfiller;
  local_38.fileName =
       (char *)kj::_::
               TransformPromiseNode<capnp::Capability::Client,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.h:916:15),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.h:917:15)>
               ::anon_class_8_1_a7efefcd_for_func::operator();
  local_48.fulfiller = fulfiller;
  local_40.fulfiller = fulfiller;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::TransformPromiseNode<capnp::Capability::Client,kj::Canceler::AdapterImpl<capnp::Capability::Client>::AdapterImpl(kj::PromiseFulfiller<capnp::Capability::Client>&,kj::Canceler&,kj::Promise<capnp::Capability::Client>)::_lambda(capnp::Capability::Client&&)_1_,kj::Canceler::AdapterImpl<capnp::Capability::Client>::Promise(kj::PromiseFulfiller<capnp::Capability::Client>&,kj::Canceler&,kj::Promise<capnp::Capability::Client>)::_lambda(kj::Exception&&)_1_>,kj::_::PromiseDisposer,kj::Canceler::AdapterImpl<capnp::Capability::Client>::AdapterImpl(kj::PromiseFulfiller<capnp::Capability::Client>&,kj::Canceler&,kj::Promise<capnp::Capability::Client>)::_lambda(capnp::Capability::Client&&)_1_,kj::Canceler::AdapterImpl<capnp::Capability::Client>::Promise(kj::PromiseFulfiller<capnp::Capability::Client>&,kj::Canceler&,kj::Promise<capnp::Capability::Client>)::_lambda(kj::Exception&&)_1_,void*&>
            ((PromiseDisposer *)&local_50,(OwnPromiseNode *)inner,&local_40,&local_48,
             &local_38.fileName);
  local_58.ptr = (PromiseNode *)local_50;
  local_38.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.h";
  local_38.function = "AdapterImpl";
  local_38.lineNumber = 0x393;
  local_38.columnNumber = 0x11;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::EagerPromiseNode<kj::_::Void>,kj::_::PromiseDisposer,kj::SourceLocation&>
            ((PromiseDisposer *)&local_50,&local_58,&local_38);
  node.ptr = local_58.ptr;
  (this->inner).super_PromiseBase.node.ptr = (PromiseNode *)local_50;
  if (&(local_58.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
    local_58.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(node.ptr)->super_PromiseArenaMember);
  }
  return;
}

Assistant:

AdapterImpl(PromiseFulfiller<T>& fulfiller,
                Canceler& canceler, Promise<T> inner)
        : AdapterBase(canceler),
          fulfiller(fulfiller),
          inner(inner.then(
              [&fulfiller](T&& value) { fulfiller.fulfill(kj::mv(value)); },
              [&fulfiller](Exception&& e) { fulfiller.reject(kj::mv(e)); })
              .eagerlyEvaluate(nullptr)) {}